

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# criticalsection.cc
# Opt level: O2

void __thiscall rtc::GlobalLockPod::Unlock(GlobalLockPod *this)

{
  int v2;
  string *result;
  FatalMessage local_180;
  
  LOCK();
  v2 = this->lock_acquired;
  if (v2 == 1) {
    this->lock_acquired = 0;
    v2 = 1;
  }
  UNLOCK();
  result = CheckEQImpl_abi_cxx11_(1,v2,"1 == old_value");
  if (result != (string *)0x0) {
    FatalMessage::FatalMessage
              (&local_180,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/base/criticalsection.cc"
               ,0xe8,result);
    std::operator<<((ostream *)&local_180,"Unlock called without calling Lock first");
    FatalMessage::~FatalMessage(&local_180);
  }
  return;
}

Assistant:

void GlobalLockPod::Unlock() {
  int old_value = AtomicOps::CompareAndSwap(&lock_acquired, 1, 0);
  RTC_DCHECK_EQ(1, old_value) << "Unlock called without calling Lock first";
}